

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_create(REF_HISTOGRAM *ref_histogram_ptr)

{
  REF_HISTOGRAM pRVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  pRVar1 = (REF_HISTOGRAM)malloc(0x50);
  *ref_histogram_ptr = pRVar1;
  if (pRVar1 == (REF_HISTOGRAM)0x0) {
    pcVar5 = "malloc *ref_histogram_ptr of REF_HISTOGRAM_STRUCT NULL";
    uVar4 = 0x23;
  }
  else {
    pRVar1->nbin = 0x12;
    pRVar1->exp = 6.0;
    pRVar2 = (REF_INT *)calloc(1,0x48);
    pRVar1->bins = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) {
      pcVar5 = "malloc ref_histogram->bins of REF_INT NULL";
      uVar4 = 0x2a;
    }
    else {
      pRVar1->max = -1e+20;
      pRVar1->min = 1e+20;
      pRVar1->log_total = 0.0;
      pRVar1->log_mean = 0.0;
      pRVar1->nstat = 5;
      pRVar3 = (REF_DBL *)calloc(1,0x28);
      pRVar1->stats = pRVar3;
      if (pRVar3 != (REF_DBL *)0x0) {
        pRVar1->df = (FILE *)0x0;
        return 0;
      }
      pcVar5 = "malloc ref_histogram->stats of REF_DBL NULL";
      uVar4 = 0x34;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar4
         ,"ref_histogram_create",pcVar5);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_create(REF_HISTOGRAM *ref_histogram_ptr) {
  REF_HISTOGRAM ref_histogram;

  ref_malloc(*ref_histogram_ptr, 1, REF_HISTOGRAM_STRUCT);
  ref_histogram = (*ref_histogram_ptr);

  ref_histogram_nbin(ref_histogram) = 18;
  ref_histogram_exp(ref_histogram) = 6.0;

  ref_malloc_init(ref_histogram->bins, ref_histogram_nbin(ref_histogram),
                  REF_INT, 0);

  ref_histogram_max(ref_histogram) = -1.0e20;
  ref_histogram_min(ref_histogram) = 1.0e20;
  ref_histogram_log_total(ref_histogram) = 0.0;
  ref_histogram_log_mean(ref_histogram) = 0.0;

  ref_histogram_nstat(ref_histogram) = 5;

  ref_malloc_init(ref_histogram->stats, ref_histogram_nstat(ref_histogram),
                  REF_DBL, 0.0);

  ref_histogram->df = NULL;

  return REF_SUCCESS;
}